

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

void INT_CMadd_poll(CManager_conflict cm,CMPollFunc func,void *client_data)

{
  int iVar1;
  CMControlList p_Var2;
  func_entry *ptr;
  func_entry *pfVar3;
  uint uVar4;
  
  p_Var2 = cm->control_list;
  ptr = p_Var2->polling_function_list;
  uVar4 = 0;
  pfVar3 = ptr;
  do {
    if (ptr == (func_entry *)0x0) {
      ptr = (func_entry *)INT_CMmalloc(0x140);
      p_Var2->pflist_size = 10;
LAB_00115030:
      ptr[uVar4].cm = cm;
      ptr[uVar4].func = func;
      ptr[uVar4].client_data = client_data;
      ptr[(ulong)uVar4 + 1].func = (CMPollFunc)0x0;
      p_Var2->polling_function_list = ptr;
      return;
    }
    if (pfVar3->func == (CMPollFunc)0x0) {
      iVar1 = p_Var2->pflist_size;
      if (iVar1 < (int)(uVar4 - 2)) {
        p_Var2->pflist_size = iVar1 * 2;
        ptr = (func_entry *)INT_CMrealloc(ptr,(long)iVar1 << 6);
      }
      goto LAB_00115030;
    }
    uVar4 = uVar4 + 1;
    pfVar3 = pfVar3 + 1;
  } while( true );
}

Assistant:

extern
void
INT_CMadd_poll(CManager cm, CMPollFunc func, void *client_data)
{
    CMControlList_add_poll(cm->control_list, cm, func, client_data);
}